

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Vec_Ptr_t * Abc_NodeGetSuper(Abc_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj;
  void *Entry;
  int local_34;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAnd;
  Vec_Ptr_t *vFront;
  Vec_Ptr_t *vSuper;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if ((iVar1 != 0) && (iVar1 = Abc_ObjIsComplement(pNode), iVar1 == 0)) {
    p = Vec_PtrAlloc(100);
    pVVar2 = Vec_PtrAlloc(100);
    Vec_PtrPush(pVVar2,pNode);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pVVar2), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2,local_34);
      pObj = Abc_ObjChild0(pAVar3);
      iVar1 = Abc_ObjIsNode(pObj);
      if (((iVar1 == 0) || (iVar1 = Abc_ObjIsComplement(pObj), iVar1 != 0)) ||
         (iVar1 = Abc_ObjFanoutNum(pObj), iVar1 != 1)) {
        Vec_PtrPush(p,pObj);
      }
      else {
        Vec_PtrPush(pVVar2,pObj);
      }
      pAVar3 = Abc_ObjChild1(pAVar3);
      iVar1 = Abc_ObjIsNode(pAVar3);
      if (((iVar1 == 0) || (iVar1 = Abc_ObjIsComplement(pAVar3), iVar1 != 0)) ||
         (iVar1 = Abc_ObjFanoutNum(pAVar3), iVar1 != 1)) {
        Vec_PtrPush(p,pAVar3);
      }
      else {
        Vec_PtrPush(pVVar2,pAVar3);
      }
    }
    Vec_PtrFree(pVVar2);
    iVar1 = Vec_PtrSize(p);
    pVVar2 = Vec_PtrAlloc(iVar1);
    local_34 = Vec_PtrSize(p);
    while (local_34 = local_34 + -1, -1 < local_34) {
      Entry = Vec_PtrEntry(p,local_34);
      Vec_PtrPush(pVVar2,Entry);
    }
    Vec_PtrFree(p);
    Vec_PtrUniqify(pVVar2,Vec_CompareNodeIds);
    return pVVar2;
  }
  __assert_fail("Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0x26a,"Vec_Ptr_t *Abc_NodeGetSuper(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NodeGetSuper( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vSuper, * vFront;
    Abc_Obj_t * pAnd, * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode) );
    vSuper = Vec_PtrAlloc( 100 ); 
    // explore the frontier
    vFront = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vFront, pNode );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pAnd, i )
    {
        pFanin = Abc_ObjChild0(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );

        pFanin = Abc_ObjChild1(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );
    }
    Vec_PtrFree( vFront );
    // reverse the array of pointers to start with lower IDs
    vFront = Vec_PtrAlloc( Vec_PtrSize(vSuper) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vSuper, pNode, i )
        Vec_PtrPush( vFront, pNode );
    Vec_PtrFree( vSuper );
    vSuper = vFront;
    // uniquify and return the frontier
    Vec_PtrUniqify( vSuper, (int (*)())Vec_CompareNodeIds );
    return vSuper;
}